

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccelerometerSensor.cpp
# Opt level: O2

string * __thiscall
iDynTree::AccelerometerSensor::getName_abi_cxx11_
          (string *__return_storage_ptr__,AccelerometerSensor *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->pimpl);
  return __return_storage_ptr__;
}

Assistant:

std::string AccelerometerSensor::getName() const
{
    return this->pimpl->name;
}